

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# set_timings.c
# Opt level: O0

int write_to_file(char *path,char *data)

{
  FILE *__stream;
  char *in_RSI;
  char *in_RDI;
  FILE *file;
  uint local_4;
  
  __stream = fopen(in_RDI,"wb");
  if (__stream != (FILE *)0x0) {
    fputs(in_RSI,__stream);
    fclose(__stream);
  }
  local_4 = (uint)(__stream == (FILE *)0x0);
  return local_4;
}

Assistant:

static int
write_to_file(const char *path, const char *data)
{
	FILE *file = fopen(path, "wb");
	if (!file)
		return 1;
	fputs(data, file);
	fclose(file);
	return 0;
}